

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  int iVar1;
  Rep *pRVar2;
  void **ppvVar3;
  Nonnull<const_char_*> pcVar4;
  
  if (start < 0) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)start,0,"start >= 0");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if (num < 0) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)num,0,"num >= 0");
    }
    else {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
      if (iVar1 < num + start) {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((long)(num + start),(long)iVar1,"start + num <= size()");
      }
      else {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar4 == (Nonnull<const_char_*>)0x0) {
        if (0 < num) {
          if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0)
          {
            ppvVar3 = (void **)this;
            if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
              pRVar2 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
              ppvVar3 = pRVar2->elements;
            }
            memcpy(elements,ppvVar3 + start,(ulong)(uint)num << 3);
          }
          internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
          return;
        }
        return;
      }
      goto LAB_001e1b1e;
    }
  }
  else {
    RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
  }
  RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
LAB_001e1b1e:
  RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != nullptr) {
      memcpy(elements, data() + start, num * sizeof(Element*));
    }
    CloseGap(start, num);
  }
}